

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void __thiscall Hex::Hexdumper<char>::dump(Hexdumper<char> *this,ostream *os)

{
  uint uVar1;
  long lVar2;
  ostream filler;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  uint uVar7;
  int unitsperline;
  char *pcVar8;
  char *first;
  char *pcVar9;
  pair<const_char_*,_const_char_*> curline;
  pair<const_char_*,_const_char_*> local_88;
  long local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  pair<const_char_*,_const_char_*> local_58;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar6 = *(long *)(*(long *)os + -0x18);
  poVar5 = os + lVar6;
  if (os[lVar6 + 0xe1] == (ostream)0x1) {
    filler = poVar5[0xe0];
  }
  else {
    filler = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = filler;
    poVar5[0xe1] = (ostream)0x1;
    lVar6 = *(long *)(*(long *)os + -0x18);
  }
  iVar4 = *(int *)(os + lVar6 + 0x10);
  uVar1 = *(uint *)(os + lVar6 + 0x18);
  uVar7 = uVar1 & 0xb0;
  if ((uVar1 >> 10 & 1) != 0) {
    Hexdumper_base::getbaseofs(os);
  }
  local_38 = Hexdumper_base::getstep(os);
  local_40 = Hexdumper_base::getthreshold(os);
  unitsperline = 0x40;
  if ((uVar1 >> 0xb & 1) == 0) {
    unitsperline = 0x10;
  }
  if (uVar7 == 0x20) {
    unitsperline = 0x20;
  }
  if (iVar4 != -1) {
    unitsperline = iVar4;
  }
  first = this->_first;
  lVar6 = *(long *)os;
  lVar2 = *(long *)(lVar6 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 0x10) = 0;
  pcVar9 = this->_last;
  local_58.first = first;
  local_58.second = first;
  if (first < pcVar9) {
    local_5c = uVar1 & 0x4a;
    local_70 = (long)unitsperline;
    local_60 = uVar1 >> 0xe & 1;
    local_64 = uVar1 >> 9 & 1;
    do {
      pcVar8 = first + local_70;
      if (pcVar9 <= pcVar8) {
        pcVar8 = this->_last;
      }
      if (unitsperline == 0) {
        pcVar8 = pcVar9;
      }
      local_88.first = first;
      local_88.second = pcVar8;
      if ((uVar1 >> 0xc & 1) == 0) {
LAB_001277d2:
        if ((uVar1 >> 10 & 1) != 0) {
          lVar6 = *(long *)os;
          *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 0x10) = 8;
          poVar5 = os + *(long *)(lVar6 + -0x18);
          if (os[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar5);
            poVar5[0xe1] = (ostream)0x1;
            lVar6 = *(long *)os;
          }
          poVar5[0xe0] = (ostream)0x30;
          *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
               *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        }
        if ((uVar1 >> 0xb & 1) == 0) {
          output_hex(os,local_88.first,local_88.second,(char)filler,local_5c,SUB41(local_64,0),
                     SUB41(local_60,0));
          if ((unitsperline != 0) && ((long)pcVar8 - (long)first != local_70)) {
            output_padding(os,unitsperline - (int)((long)pcVar8 - (long)first),(char)filler);
          }
          if (uVar7 != 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
            goto LAB_001278c7;
          }
LAB_001278c1:
          if (unitsperline == 0) goto LAB_0012790a;
        }
        else {
          if (uVar7 == 0x20) goto LAB_001278c1;
LAB_001278c7:
          output_asc(os,local_88.first,local_88.second);
          if (unitsperline == 0) goto LAB_0012790a;
          if ((long)pcVar8 - (long)first != local_70) {
            output_asc_padding(os,unitsperline - (int)((long)pcVar8 - (long)first));
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      else {
        bVar3 = data_is_equal<std::pair<char_const*,char_const*>>(&local_58,&local_88);
        if (!bVar3) {
          local_58.first = local_88.first;
          local_58.second = local_88.second;
          goto LAB_001277d2;
        }
        iVar4 = count_identical_lines(first,this->_last,unitsperline);
        if (iVar4 <= (int)local_40) goto LAB_001277d2;
        std::__ostream_insert<char,std::char_traits<char>>(os,"* [ 0x",6);
        *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)os,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," lines ]\n",9);
        pcVar8 = first + iVar4 * unitsperline;
      }
LAB_0012790a:
      pcVar9 = first + local_38;
      first = pcVar8;
      if (local_38 != 0) {
        first = pcVar9;
      }
      pcVar9 = this->_last;
    } while (first < pcVar9);
  }
  Hexdumper_base::clearflags(os);
  return;
}

Assistant:

void dump(std::ostream& os) const
    {
        // make copy of current 'os' settings
        char filler = os.fill();  // what to output between hex numbers.
        int unitsperline = os.width();  // when not set: everything on one line
        // upl == 0 -> everything on one line
        // upl ==-1 -> unspecified -> use defaults
        //int unitwidth = os.precision(); // NOT USED (yet)
        int adjust = os.flags() & os.adjustfield;
        int numberbase = os.flags() & os.basefield;

        bool showbase = os.flags() & os.showbase;
        bool showpos = os.flags() & os.showpos;
        bool showoffset = os.flags() & os.showpoint;
        bool uppercasehex = os.flags() & os.uppercase;
        bool summarize = os.flags() & os.skipws;

        uint64_t ofs = showoffset ? getbaseofs(os) : 0;
        uint64_t step = getstep(os);

        int threshold = getthreshold(os);

        // showpos adjust
        //   yes     left    %+-b     ...    invalid
        //   yes     right   %+b     asc only
        //   no      left    %-b     hex only
        //   no      right   %b      hex + asc

        if (unitsperline==-1) {
            if (adjust == os.left)
                unitsperline = 32 / sizeof(T);
            else if (showpos)
                unitsperline = 64 / sizeof(T);
            else
                unitsperline = 16 / sizeof(T);
        }

        auto p = _first;

        //auto prevp = p;
        auto prevline = std::make_pair(p, p);

        os << std::right;
        os.width(0);
        while (p < _last) {
            auto pend = unitsperline ? std::min(_last, p+unitsperline) : _last;
            auto curline = std::make_pair(p, pend);
            if (summarize) {
                if (data_is_equal(prevline, curline)) {
                    int count = count_identical_lines(p, _last, unitsperline);
                    if (count > threshold) {
                        os << "* [ 0x" << std::hex << count << " lines ]\n";
                        pend = p + count * unitsperline;

                        goto next;
                    }
                }
                else {
                    prevline = curline;
                }
            }

            if (showoffset)
                os << std::setw(8) << std::setfill('0') << std::hex << ofs << ": ";
            if (!showpos) {
                output_hex(os, curline.first, curline.second, filler, numberbase, showbase, uppercasehex);
                if (unitsperline && pend-p != unitsperline)
                    output_padding(os, unitsperline-(pend-p), filler);
            }

            if (!showpos && adjust != os.left)
                os << "  ";   // separate left from right
            if (adjust != os.left)
            {
                output_asc(os, curline.first, curline.second);
                if (unitsperline && pend-p != unitsperline)
                    output_asc_padding(os, unitsperline-(pend-p));
            }

            if (unitsperline)
                os << "\n";

        next:
            if (step) {
                ofs += step;
                p += step;
            }
            else {
                ofs += sizeof(T) * (pend-p);
                p = pend;
            }
        }
        clearflags(os);
    }